

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.cxx
# Opt level: O2

bool __thiscall
cmWriteFileCommand::InitialPass
          (cmWriteFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  ostream *poVar2;
  pointer __lhs;
  allocator local_2b9;
  _Ios_Openmode local_2b8;
  mode_t mode;
  string fileName;
  string dir;
  string error;
  string message;
  ofstream file;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string
              ((string *)&file,"called with incorrect number of arguments",(allocator *)&message);
    cmCommand::SetError(&this->super_cmCommand,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    bVar1 = false;
  }
  else {
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&fileName,(string *)__lhs);
    local_2b8 = _S_out;
    while (__lhs = __lhs + 1,
          __lhs != (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = std::operator==(__lhs,"APPEND");
      if (bVar1) {
        local_2b8 = _S_app;
      }
      else {
        std::__cxx11::string::append((string *)&message);
      }
    }
    bVar1 = cmMakefile::CanIWriteThisFile
                      ((this->super_cmCommand).Makefile,fileName._M_dataplus._M_p);
    if (bVar1) {
      cmsys::SystemTools::GetFilenamePath(&dir,&fileName);
      cmsys::SystemTools::MakeDirectory(dir._M_dataplus._M_p);
      mode = 0;
      bVar1 = cmsys::SystemTools::GetPermissions(fileName._M_dataplus._M_p,&mode);
      if (bVar1) {
        cmsys::SystemTools::SetPermissions(fileName._M_dataplus._M_p,mode | 0x90);
      }
      std::ofstream::ofstream(&file,fileName._M_dataplus._M_p,local_2b8);
      bVar1 = ((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
               [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]] & 5) == 0;
      if (bVar1) {
        poVar2 = std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)&message);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::ofstream::close();
        if (mode != 0) {
          cmsys::SystemTools::SetPermissions(fileName._M_dataplus._M_p,mode);
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&error,"Internal CMake error when trying to open file: ",&local_2b9);
        std::__cxx11::string::append((char *)&error);
        std::__cxx11::string::append((char *)&error);
        cmCommand::SetError(&this->super_cmCommand,&error);
        std::__cxx11::string::~string((string *)&error);
      }
      std::ofstream::~ofstream(&file);
      std::__cxx11::string::~string((string *)&dir);
    }
    else {
      std::operator+(&dir,"attempted to write a file: ",&fileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,&dir
                     ," into a source directory.");
      std::__cxx11::string::~string((string *)&dir);
      cmCommand::SetError(&this->super_cmCommand,(string *)&file);
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::string::~string((string *)&file);
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&fileName);
    std::__cxx11::string::~string((string *)&message);
  }
  return bVar1;
}

Assistant:

bool cmWriteFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string message;
  std::vector<std::string>::const_iterator i = args.begin();

  std::string fileName = *i;
  bool overwrite = true;
  i++;

  for(;i != args.end(); ++i)
    {
    if ( *i == "APPEND" )
      {
      overwrite = false;
      }
    else
      {
      message += *i;
      }
    }

  if ( !this->Makefile->CanIWriteThisFile(fileName.c_str()) )
    {
    std::string e = "attempted to write a file: " + fileName
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir.c_str());

  mode_t mode = 0;

  // Set permissions to writable
  if ( cmSystemTools::GetPermissions(fileName.c_str(), mode) )
    {
    cmSystemTools::SetPermissions(fileName.c_str(),
#if defined( _MSC_VER ) || defined( __MINGW32__ )
      mode | S_IWRITE
#else
      mode | S_IWUSR | S_IWGRP
#endif
    );
    }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                     overwrite?std::ios::out : std::ios::app);
  if ( !file )
    {
    std::string error = "Internal CMake error when trying to open file: ";
    error += fileName.c_str();
    error += " for writing.";
    this->SetError(error);
    return false;
    }
  file << message << std::endl;
  file.close();
  if(mode)
    {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
    }

  return true;
}